

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall
mkvparser::Tracks::Tracks
          (Tracks *this,Segment *pSegment,longlong start,longlong size_,longlong element_start,
          longlong element_size)

{
  this->m_pSegment = pSegment;
  this->m_start = start;
  this->m_size = size_;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  this->m_trackEntries = (Track **)0x0;
  this->m_trackEntriesEnd = (Track **)0x0;
  return;
}

Assistant:

Tracks::Tracks(Segment* pSegment, long long start, long long size_,
               long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_start(start),
      m_size(size_),
      m_element_start(element_start),
      m_element_size(element_size),
      m_trackEntries(NULL),
      m_trackEntriesEnd(NULL) {}